

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O3

Error __thiscall asmjit::BaseRAPass::runLocalAllocator(BaseRAPass *this)

{
  uint uVar1;
  BaseNode *pBVar2;
  InstNode *pIVar3;
  InstNode *pIVar4;
  undefined8 *puVar5;
  WorkToPhysMap *__src;
  BaseCompiler *pBVar6;
  FuncNode *pFVar7;
  ulong uVar8;
  bool bVar9;
  Error EVar10;
  BaseBuilder *pBVar11;
  uint32_t *puVar12;
  InstNode *pIVar13;
  InstNode *pIVar14;
  bool bVar15;
  FuncFrame *frame;
  EVP_PKEY_CTX *ctx;
  BaseRAPass *this_00;
  RABlock *block;
  uint uVar16;
  size_type sVar17;
  RALocalAllocator lra;
  RABlock *local_148;
  undefined1 local_118 [64];
  uint local_d8;
  uint local_d4;
  Slot *local_c8;
  PhysToWorkMap *local_c0;
  RABlock *local_50;
  
  local_118._8_8_ = (this->super_FuncPass).super_Pass._cb;
  local_118._16_8_ = this->_archTraits;
  local_118._24_8_ = *(undefined8 *)(this->_availableRegs)._masks;
  local_118._32_8_ = *(undefined8 *)((this->_availableRegs)._masks + 2);
  ctx = (EVP_PKEY_CTX *)0x0;
  local_118._0_8_ = this;
  memset(local_118 + 0x28,0,0xc0);
  this_00 = (BaseRAPass *)local_118;
  EVar10 = RALocalAllocator::init((RALocalAllocator *)this_00,ctx);
  if ((EVar10 == 0) && (EVar10 = 0, (this->_blocks).super_ZoneVectorBase._size != 0)) {
    block = *(this->_blocks).super_ZoneVectorBase._data;
    if ((block->_flags & 2) == 0) {
LAB_0011f879:
      runLocalAllocator();
LAB_0011f87e:
      runLocalAllocator();
LAB_0011f883:
      runLocalAllocator();
      pBVar6 = (BaseCompiler *)(this_00->super_FuncPass).super_Pass._cb;
      pFVar7 = this_00->_func;
      (pBVar6->super_BaseBuilder)._cursor = (BaseNode *)pFVar7;
      frame = &pFVar7->_frame;
      EVar10 = BaseEmitter::emitProlog((BaseEmitter *)pBVar6,frame);
      if ((EVar10 == 0) &&
         (EVar10 = BaseEmitHelper::emitArgsAssignment
                             (this_00->_iEmitHelper,frame,&this_00->_argsAssignment), EVar10 == 0))
      {
        pBVar6 = (BaseCompiler *)(this_00->super_FuncPass).super_Pass._cb;
        (pBVar6->super_BaseBuilder)._cursor = &this_00->_func->_exitNode->super_BaseNode;
        EVar10 = BaseEmitter::emitEpilog((BaseEmitter *)pBVar6,frame);
      }
      return EVar10;
    }
    sVar17 = (this->_pov).super_ZoneVectorBase._size;
    RALocalAllocator::makeInitialAssignment((RALocalAllocator *)local_118);
    this_00 = this;
    EVar10 = setBlockEntryAssignment(this,block,block,(RAAssignment *)(local_118 + 0x38));
    if (EVar10 == 0) {
      uVar16 = 0;
LAB_0011f4eb:
      pIVar13 = (InstNode *)block->_first;
      uVar1 = block->_flags;
      pIVar14 = (InstNode *)0x0;
      if ((uVar1 >> 8 & 1) != 0) {
        pIVar14 = (InstNode *)block->_last;
      }
      pBVar2 = (pIVar13->super_BaseNode).field_0.field_0._prev;
      pIVar3 = (InstNode *)(((InstNode *)block->_last)->super_BaseNode).field_0.field_0._next;
      local_50 = block;
      if ((block->_successors).super_ZoneVectorBase._size == 0) {
        block->_flags = uVar1 | 8;
        if (pIVar13 != pIVar3) {
          local_148 = (RABlock *)0x0;
          goto LAB_0011f574;
        }
LAB_0011f729:
        local_148 = (RABlock *)0x0;
        bVar15 = true;
      }
      else {
        local_148 = *(block->_successors).super_ZoneVectorBase._data;
        block->_flags = uVar1 | 8;
        if (pIVar13 == pIVar3) {
          if (local_148 == (RABlock *)0x0) goto LAB_0011f729;
          pBVar11 = (this->super_FuncPass).super_Pass._cb;
          pIVar13 = (InstNode *)&pBVar11->_lastNode;
          if (pIVar3 != (InstNode *)0x0) {
            pIVar13 = pIVar3;
          }
LAB_0011f689:
          pIVar13 = (InstNode *)(pIVar13->super_BaseNode).field_0.field_0._prev;
        }
        else {
LAB_0011f574:
          bVar15 = false;
          do {
            pIVar4 = (InstNode *)(pIVar13->super_BaseNode).field_0._links[1];
            if (((pIVar13->super_BaseNode).field_1._any._nodeFlags & 0x20) != 0) {
              bVar9 = bVar15;
              if (pIVar13 == pIVar14) {
                uVar1 = (block->_successors).super_ZoneVectorBase._size;
                if ((block->_flags & 0x200) == 0) {
                  bVar9 = true;
                  if (uVar1 < 2) goto LAB_0011f596;
                  this_00 = (BaseRAPass *)local_118;
                  EVar10 = RALocalAllocator::allocJumpTable
                                     ((RALocalAllocator *)this_00,pIVar13,&block->_successors,
                                      (RABlock *)0x0);
                }
                else {
                  if (uVar1 == 0) goto LAB_0011f883;
                  puVar5 = (undefined8 *)(block->_successors).super_ZoneVectorBase._data;
                  this_00 = (BaseRAPass *)local_118;
                  EVar10 = RALocalAllocator::allocBranch
                                     ((RALocalAllocator *)this_00,pIVar13,
                                      (RABlock *)puVar5[uVar1 - 1],(RABlock *)*puVar5);
                }
              }
              else {
LAB_0011f596:
                bVar15 = bVar9;
                EVar10 = RALocalAllocator::allocInst((RALocalAllocator *)local_118,pIVar13);
                if (EVar10 != 0) {
                  return EVar10;
                }
                if ((pIVar13->super_BaseNode).field_1._any._nodeType == '\x12') {
                  this_00 = this;
                  EVar10 = (*(this->super_FuncPass).super_Pass._vptr_Pass[0xe])(this,pIVar13);
                }
                else {
                  this_00 = (BaseRAPass *)local_118;
                  EVar10 = RALocalAllocator::spillAfterAllocation
                                     ((RALocalAllocator *)this_00,pIVar13);
                }
              }
              if (EVar10 != 0) {
                return EVar10;
              }
            }
            pIVar13 = pIVar4;
          } while (pIVar4 != pIVar3);
          if (local_148 == (RABlock *)0x0) goto LAB_0011f729;
          pBVar11 = (this->super_FuncPass).super_Pass._cb;
          pIVar13 = (InstNode *)&pBVar11->_lastNode;
          if (pIVar3 != (InstNode *)0x0) {
            pIVar13 = pIVar3;
          }
          pIVar13 = (InstNode *)(pIVar13->super_BaseNode).field_0.field_0._prev;
          if (bVar15) goto LAB_0011f689;
        }
        pBVar11->_cursor = &pIVar13->super_BaseNode;
        if (local_148->_entryPhysToWorkMap == (PhysToWorkMap *)0x0) {
          uVar1 = local_148->_sharedAssignmentId;
          if ((ulong)uVar1 == 0xffffffff) {
            puVar12 = &local_148->_entryScratchGpRegs;
          }
          else {
            if ((local_148->_ra->_sharedAssignments).super_ZoneVectorBase._size <= uVar1)
            goto LAB_0011f87e;
            puVar12 = (uint32_t *)
                      ((ulong)uVar1 * 0x28 +
                      (long)(local_148->_ra->_sharedAssignments).super_ZoneVectorBase._data);
          }
          EVar10 = RALocalAllocator::spillScratchGpRegsBeforeEntry
                             ((RALocalAllocator *)local_118,*puVar12);
          if (EVar10 != 0) {
            return EVar10;
          }
          EVar10 = setBlockEntryAssignment(this,local_148,block,(RAAssignment *)(local_118 + 0x38));
          if (EVar10 != 0) {
            return EVar10;
          }
          __src = local_148->_entryWorkToPhysMap;
          memcpy(local_c0,local_148->_entryPhysToWorkMap,(ulong)local_d8 * 4 + 0x20);
          memcpy(local_c8,__src,(ulong)local_d4);
          bVar15 = false;
        }
        else {
          bVar15 = false;
          EVar10 = RALocalAllocator::switchToAssignment
                             ((RALocalAllocator *)local_118,local_148->_entryPhysToWorkMap,
                              local_148->_entryWorkToPhysMap,local_148->_liveBits,
                              SUB41((local_148->_flags & 8) >> 3,0),false);
          if (EVar10 != 0) {
            return EVar10;
          }
        }
      }
      block->_first = (pBVar2->field_0).field_0._next;
      pIVar13 = (InstNode *)&((this->super_FuncPass).super_Pass._cb)->_lastNode;
      if (pIVar3 != (InstNode *)0x0) {
        pIVar13 = pIVar3;
      }
      block->_last = (pIVar13->super_BaseNode).field_0.field_0._prev;
      sVar17 = sVar17 - 1;
      if (sVar17 != 0) {
        this_00 = (BaseRAPass *)0x0;
        if ((bVar15) || (block = local_148, (local_148->_flags & 8) != 0)) {
          uVar1 = (this->_blocks).super_ZoneVectorBase._size;
          uVar16 = uVar16 + 1;
          if (uVar1 <= uVar16) {
            uVar16 = 0;
          }
          if (uVar1 <= uVar16) {
            runLocalAllocator();
            goto LAB_0011f879;
          }
          while ((block = *(RABlock **)
                           ((long)(this->_blocks).super_ZoneVectorBase._data + (ulong)uVar16 * 8),
                 (block->_flags & 10) != 2 || (block->_entryPhysToWorkMap == (PhysToWorkMap *)0x0)))
          {
            uVar16 = uVar16 + 1;
            if (uVar1 <= uVar16) {
              uVar16 = 0;
            }
          }
          this_00 = (BaseRAPass *)local_118;
          RALocalAllocator::replaceAssignment
                    ((RALocalAllocator *)this_00,block->_entryPhysToWorkMap,
                     block->_entryWorkToPhysMap);
        }
        goto LAB_0011f4eb;
      }
      uVar8 = *(ulong *)((this->_clobberedRegs)._masks + 2);
      *(ulong *)(this->_clobberedRegs)._masks =
           local_118._40_8_ | *(ulong *)(this->_clobberedRegs)._masks;
      *(ulong *)((this->_clobberedRegs)._masks + 2) = local_118._48_8_ | uVar8;
      EVar10 = 0;
    }
  }
  return EVar10;
}

Assistant:

Error BaseRAPass::runLocalAllocator() noexcept {
  RALocalAllocator lra(this);
  ASMJIT_PROPAGATE(lra.init());

  if (!blockCount())
    return kErrorOk;

  // The allocation is done when this reaches zero.
  uint32_t blocksRemaining = reachableBlockCount();

  // Current block.
  uint32_t blockId = 0;
  RABlock* block = _blocks[blockId];

  // The first block (entry) must always be reachable.
  ASMJIT_ASSERT(block->isReachable());

  // Assign function arguments for the initial block. The `lra` is valid now.
  lra.makeInitialAssignment();
  ASMJIT_PROPAGATE(setBlockEntryAssignment(block, block, lra._curAssignment));

  // The loop starts from the first block and iterates blocks in order, however,
  // the algorithm also allows to jump to any other block when finished if it's
  // a jump target. In-order iteration just makes sure that all blocks are visited.
  for (;;) {
    BaseNode* first = block->first();
    BaseNode* last = block->last();
    BaseNode* terminator = block->hasTerminator() ? last : nullptr;

    BaseNode* beforeFirst = first->prev();
    BaseNode* afterLast = last->next();

    bool unconditionalJump = false;
    RABlock* consecutive = nullptr;

    if (block->hasSuccessors())
      consecutive = block->successors()[0];

    lra.setBlock(block);
    block->makeAllocated();

    BaseNode* node = first;
    while (node != afterLast) {
      BaseNode* next = node->next();
      if (node->isInst()) {
        InstNode* inst = node->as<InstNode>();

        if (ASMJIT_UNLIKELY(inst == terminator)) {
          const RABlocks& successors = block->successors();
          if (block->hasConsecutive()) {
            ASMJIT_PROPAGATE(lra.allocBranch(inst, successors.last(), successors.first()));

            node = next;
            continue;
          }
          else if (successors.size() > 1) {
            RABlock* cont = block->hasConsecutive() ? successors.first() : nullptr;
            ASMJIT_PROPAGATE(lra.allocJumpTable(inst, successors, cont));

            node = next;
            continue;
          }
          else {
            // Otherwise this is an unconditional jump, special handling isn't required.
            unconditionalJump = true;
          }
        }

        ASMJIT_PROPAGATE(lra.allocInst(inst));
        if (inst->type() == BaseNode::kNodeInvoke)
          ASMJIT_PROPAGATE(emitPreCall(inst->as<InvokeNode>()));
        else
          ASMJIT_PROPAGATE(lra.spillAfterAllocation(inst));
      }
      node = next;
    }

    if (consecutive) {
      BaseNode* prev = afterLast ? afterLast->prev() : cc()->lastNode();
      cc()->_setCursor(unconditionalJump ? prev->prev() : prev);

      if (consecutive->hasEntryAssignment()) {
        ASMJIT_PROPAGATE(
          lra.switchToAssignment(
            consecutive->entryPhysToWorkMap(),
            consecutive->entryWorkToPhysMap(),
            consecutive->liveIn(),
            consecutive->isAllocated(),
            false));
      }
      else {
        ASMJIT_PROPAGATE(lra.spillRegsBeforeEntry(consecutive));
        ASMJIT_PROPAGATE(setBlockEntryAssignment(consecutive, block, lra._curAssignment));
        lra._curAssignment.copyFrom(consecutive->entryPhysToWorkMap(), consecutive->entryWorkToPhysMap());
      }
    }

    // Important as the local allocator can insert instructions before
    // and after any instruction within the basic block.
    block->setFirst(beforeFirst->next());
    block->setLast(afterLast ? afterLast->prev() : cc()->lastNode());

    if (--blocksRemaining == 0)
      break;

    // Switch to the next consecutive block, if any.
    if (consecutive) {
      block = consecutive;
      if (!block->isAllocated())
        continue;
    }

    // Get the next block.
    for (;;) {
      if (++blockId >= blockCount())
        blockId = 0;

      block = _blocks[blockId];
      if (!block->isReachable() || block->isAllocated() || !block->hasEntryAssignment())
        continue;

      break;
    }

    // If we switched to some block we have to update the local allocator.
    lra.replaceAssignment(block->entryPhysToWorkMap(), block->entryWorkToPhysMap());
  }

  _clobberedRegs.op<Support::Or>(lra._clobberedRegs);
  return kErrorOk;
}